

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

void __thiscall
ot::commissioner::coap::Coap::SendRequest(Coap *this,Request *aRequest,ResponseHandler *aHandler)

{
  char cVar1;
  element_type *peVar2;
  ErrorCode EVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  long lVar6;
  format_args args;
  shared_ptr<ot::commissioner::coap::Message> request;
  Error error;
  writer write;
  RequestPtr local_130;
  ErrorCode local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined8 local_d0;
  writer local_c8;
  _Any_data local_c0;
  code *local_b0;
  string local_a0;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_68 [16];
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_120 = 0;
  local_110 = 0;
  local_108[0] = 0;
  local_130.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (Message *)0x0;
  local_118 = local_108;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::coap::Message,std::allocator<ot::commissioner::coap::Message>,ot::commissioner::coap::Message_const&>
            (&local_130.
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Message **)&local_130,
             (allocator<ot::commissioner::coap::Message> *)local_f8,aRequest);
  peVar2 = local_130.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((undefined1  [12])
      ((undefined1  [12])
       (local_130.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->mHeader & (undefined1  [12])0x8) == (undefined1  [12])0x0) {
    if (((local_130.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->mHeader).mMessageId != 0) {
      abort();
    }
    uVar4 = (short)*(undefined4 *)&this->mMessageId + 1;
    this->mMessageId = uVar4;
    ((local_130.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->mHeader).mMessageId = uVar4;
    *(byte *)&(local_130.
               super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->mHeader =
         *(byte *)&(local_130.
                    super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mHeader & 0xf | 0x80;
    lVar6 = 0;
    do {
      uVar5 = random::non_crypto::GetUint32();
      (peVar2->mHeader).mToken[lVar6] = (uint8_t)uVar5;
      lVar6 = lVar6 + 1;
    } while ((short)lVar6 != 8);
    Send((Error *)local_f8,this,
         local_130.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr);
    local_120 = local_f8._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_f0);
    EVar3 = local_120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p);
    }
    if ((EVar3 == kNone) &&
       ((undefined1  [12])
        ((undefined1  [12])
         (local_130.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->mHeader & (undefined1  [12])0xc) == (undefined1  [12])0x0)) {
      std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
      function((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
               &local_c0,aHandler);
      RequestsCache::Put(&this->mRequestsCache,&local_130,(ResponseHandler *)&local_c0);
      if (local_b0 != (code *)0x0) {
        (*local_b0)(&local_c0,&local_c0,__destroy_functor);
      }
    }
  }
  else {
    local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
    from = "a CoAP request is neither Confirmable nor NON-Confirmable";
    local_f0._M_p = "a CoAP request is neither Confirmable nor NON-Confirmable";
    local_e8 = 0x39;
    local_e0._M_allocated_capacity = 0;
    local_d0 = 0;
    local_e0._8_8_ = (allocator<ot::commissioner::coap::Message> *)local_f8;
    local_c8.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_f8;
    do {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_c8,from,"");
          goto LAB_001f508a;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_c8,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_f8);
    } while (from != "");
LAB_001f508a:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_f8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"a CoAP request is neither Confirmable nor NON-Confirmable",
               (string_view)ZEXT816(0x39),args);
    local_58 = kInvalidArgs;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_a0._M_dataplus._M_p,
               local_a0._M_dataplus._M_p + local_a0._M_string_length);
    local_120 = local_58;
    std::__cxx11::string::operator=((string *)&local_118,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  if ((local_120 != kNone) && ((aHandler->super__Function_base)._M_manager != (_Manager_type)0x0)) {
    local_80._0_4_ = local_120;
    local_78._M_p = local_68;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_118,local_118 + local_110);
    local_f8 = (undefined1  [8])0x0;
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Message **)local_f8,(Error *)local_80);
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
  }
  if (local_130.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.
               super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  return;
}

Assistant:

void Coap::SendRequest(const Request &aRequest, ResponseHandler aHandler)
{
    Error error;
    auto  request = std::make_shared<Request>(aRequest);

    VerifyOrExit(request->IsConfirmable() || request->IsNonConfirmable(),
                 error = ERROR_INVALID_ARGS("a CoAP request is neither Confirmable nor NON-Confirmable"));

    VerifyOrDie(request->GetMessageId() == 0);
    request->SetMessageId(AllocMessageId());
    request->SetToken(kDefaultTokenLength);

    SuccessOrExit(error = Send(*request));

    if (request->IsConfirmable())
    {
        mRequestsCache.Put(request, aHandler);
    }

exit:
    if (error != ErrorCode::kNone && aHandler != nullptr)
    {
        aHandler(nullptr, error);
    }
}